

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_beab97::InstanceBuilder::~InstanceBuilder(InstanceBuilder *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  slang::SmallVectorBase<unsigned_int>::cleanup
            (&(this->path).super_SmallVectorBase<unsigned_int>,in_RSI);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                 *)&(this->implicitNetNames).super_Storage.field_0x88);
  return;
}

Assistant:

InstanceBuilder(const ASTContext& context, SmallVectorBase<const Symbol*>& implicitNets,
                    const HierarchyOverrideNode* parentOverrideNode,
                    std::span<const AttributeInstanceSyntax* const> attributes,
                    bitmask<InstanceFlags> flags, const SyntaxNode* overrideSyntax) :
        netType(context.scope->getDefaultNetType()), comp(context.getCompilation()),
        context(context), parentOverrideNode(parentOverrideNode), overrideSyntax(overrideSyntax),
        implicitNets(implicitNets), attributes(attributes), flags(flags) {}